

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O1

UnblindOutputStruct *
cfd::js::api::ElementsTransactionStructApi::GetUnblindData
          (UnblindOutputStruct *__return_storage_ptr__,GetUnblindDataRequestStruct *request)

{
  string *in_R8;
  _Rb_tree_header *p_Var1;
  undefined1 local_188 [16];
  undefined1 local_178 [24];
  _Any_data local_160;
  undefined1 local_150 [16];
  undefined1 local_140 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  char local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  char local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  char local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Alloc_hider local_c8;
  char local_b8 [16];
  _Alloc_hider local_a8;
  undefined1 local_98 [24];
  _Rb_tree_node_base local_80;
  size_t local_60;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_58;
  
  UnblindOutputStruct::UnblindOutputStruct(__return_storage_ptr__);
  local_188._0_8_ = (pointer)0x0;
  local_188._8_8_ = 0;
  local_178._8_8_ =
       std::
       _Function_handler<cfd::js::api::UnblindOutputStruct_(const_cfd::js::api::GetUnblindDataRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:2290:20)>
       ::_M_invoke;
  local_178._0_8_ =
       std::
       _Function_handler<cfd::js::api::UnblindOutputStruct_(const_cfd::js::api::GetUnblindDataRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:2290:20)>
       ::_M_manager;
  local_160._M_unused._M_object = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"GetUnblindData","");
  ExecuteStructApi<cfd::js::api::GetUnblindDataRequestStruct,cfd::js::api::UnblindOutputStruct>
            ((UnblindOutputStruct *)local_140,(api *)request,
             (GetUnblindDataRequestStruct *)local_188,
             (function<cfd::js::api::UnblindOutputStruct_(const_cfd::js::api::GetUnblindDataRequestStruct_&)>
              *)&local_160,in_R8);
  __return_storage_ptr__->index = local_140._0_4_;
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->asset,(string *)(local_140 + 8));
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->blind_factor,(string *)local_118._M_local_buf);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->asset_blind_factor,(string *)local_f8._M_local_buf);
  __return_storage_ptr__->amount = local_d8._M_allocated_capacity;
  (__return_storage_ptr__->error).code = local_d8._8_4_;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->error).type,(string *)&local_c8);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->error).message,(string *)&local_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->error).ignore_items._M_t);
  if (local_80._M_parent != (_Base_ptr)0x0) {
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = local_80._M_color;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_80._M_parent;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = local_80._M_left;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = local_80._M_right;
    (local_80._M_parent)->_M_parent =
         &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_60;
    local_80._M_parent = (_Base_ptr)0x0;
    local_60 = 0;
    local_80._M_left = &local_80;
    local_80._M_right = &local_80;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->ignore_items)._M_t);
  if (_Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &_Stack_58._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _Stack_58._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_58._M_impl.super__Rb_tree_header._M_header._M_right;
    (_Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         _Stack_58._M_impl.super__Rb_tree_header._M_node_count;
    _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&_Stack_58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_98 + 0x10));
  if ((_Base_ptr)local_a8._M_p != (_Base_ptr)local_98) {
    operator_delete(local_a8._M_p);
  }
  if (local_c8._M_p != local_b8) {
    operator_delete(local_c8._M_p);
  }
  if ((char *)local_f8._M_allocated_capacity != local_e8) {
    operator_delete((void *)local_f8._M_allocated_capacity);
  }
  if ((char *)local_118._M_allocated_capacity != local_108) {
    operator_delete((void *)local_118._M_allocated_capacity);
  }
  if ((char *)local_138._M_allocated_capacity != local_128) {
    operator_delete((void *)local_138._M_allocated_capacity);
  }
  if ((undefined1 *)local_160._M_unused._0_8_ != local_150) {
    operator_delete(local_160._M_unused._M_object);
  }
  if ((code *)local_178._0_8_ != (code *)0x0) {
    (*(code *)local_178._0_8_)(local_188,local_188,3);
  }
  return __return_storage_ptr__;
}

Assistant:

UnblindOutputStruct ElementsTransactionStructApi::GetUnblindData(
    const GetUnblindDataRequestStruct& request) {
  auto call_func = [](const GetUnblindDataRequestStruct& request)
      -> UnblindOutputStruct {  // NOLINT
    UnblindOutputStruct response;
    Script locking_script_obj(request.locking_script);
    ConfidentialAssetId asset_obj(request.asset_commitment);
    ConfidentialValue value(request.value_commitment);
    ConfidentialNonce nonce(request.commitment_nonce);
    ByteData rangeproof_obj(request.rangeproof);
    Privkey blinding_key_obj = Privkey::HasWif(request.blinding_key)
                                   ? Privkey::FromWif(request.blinding_key)
                                   : Privkey(request.blinding_key);
    ConfidentialTxOut txout(
        locking_script_obj, asset_obj, value, nonce, ByteData(),
        rangeproof_obj);
    auto unblind_data = txout.Unblind(blinding_key_obj);

    response.amount = unblind_data.value.GetAmount().GetSatoshiValue();
    response.asset = unblind_data.asset.GetHex();
    response.blind_factor = unblind_data.vbf.GetHex();
    response.asset_blind_factor = unblind_data.abf.GetHex();
    return response;
  };

  UnblindOutputStruct result;
  result = ExecuteStructApi<GetUnblindDataRequestStruct, UnblindOutputStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}